

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_update(SHA256_CTX *ctx,BYTE *data,size_t len)

{
  int local_24;
  WORD i;
  size_t len_local;
  BYTE *data_local;
  SHA256_CTX *ctx_local;
  
  for (local_24 = 0; (ulong)(long)local_24 < len; local_24 = local_24 + 1) {
    ctx->data[ctx->datalen] = data[local_24];
    ctx->datalen = ctx->datalen + 1;
    if (ctx->datalen == 0x40) {
      sha256_transform(ctx,ctx->data);
      ctx->bitlen = ctx->bitlen + 0x200;
      ctx->datalen = 0;
    }
  }
  return;
}

Assistant:

static void sha256_update(SHA256_CTX *ctx, const BYTE data[], size_t len)
{
    WORD i;

    for (i = 0; i < len; ++i) {
        ctx->data[ctx->datalen] = data[i];
        ctx->datalen++;
        if (ctx->datalen == 64) {
            sha256_transform(ctx, ctx->data);
            ctx->bitlen += 512;
            ctx->datalen = 0;
        }
    }
}